

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlSchema.cpp
# Opt level: O0

void __thiscall opencollada::XmlSchema::~XmlSchema(XmlSchema *this)

{
  Uri *in_RDI;
  
  if (*(long *)&in_RDI->mUri != 0) {
    xmlSchemaFree(*(undefined8 *)&in_RDI->mUri);
    *(undefined8 *)&in_RDI->mUri = 0;
  }
  Uri::~Uri(in_RDI);
  return;
}

Assistant:

XmlSchema::~XmlSchema()
	{
		if (mSchema)
		{
			xmlSchemaFree(mSchema);
			mSchema = nullptr;
		}
	}